

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

QTextStream * __thiscall
CPP::WriteInitialization::autoTrOutput(WriteInitialization *this,DomProperty *property)

{
  bool bVar1;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (property->m_string == (DomString *)0x0) {
    if (property->m_stringList != (DomStringList *)0x0) {
      bVar1 = needsTranslation<DomStringList>(property->m_stringList);
      if (bVar1) {
        pQVar2 = &this->m_refreshOut;
        goto LAB_0012ed9b;
      }
    }
    pQVar2 = this->m_output;
  }
  else {
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
    bVar1 = needsTranslation<DomString>(property->m_string);
    if (bVar1) {
      pQVar2 = &this->m_refreshOut;
    }
    else {
      pQVar2 = this->m_output;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
LAB_0012ed9b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &WriteInitialization::autoTrOutput(const DomProperty *property)
{
    if (const DomString *str = property->elementString())
        return autoTrOutput(str);
    if (const DomStringList *list = property->elementStringList())
        if (needsTranslation(list))
            return m_refreshOut;
    return m_output;
}